

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O1

bool __thiscall
llbuild::buildsystem::ExternalCommand::canUpdateIfNewerWithResult
          (ExternalCommand *this,BuildValue *result)

{
  uint32_t uVar1;
  bool bVar2;
  FileInfo *pFVar3;
  uint n;
  bool bVar4;
  
  if (this->allowModifiedOutputs == true) {
    if ((SuccessfulCommandWithOutputSignature < result->kind) ||
       ((0x20414U >> (result->kind & (FilteredDirectoryContents|Target)) & 1) == 0)) {
      __assert_fail("kindHasOutputInfo() && \"invalid call for value kind\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                    ,0x186,"unsigned int llbuild::buildsystem::BuildValue::getNumOutputs() const");
    }
    uVar1 = result->numOutputInfos;
    bVar4 = uVar1 == 0;
    if (!bVar4) {
      pFVar3 = BuildValue::getNthOutputInfo(result,0);
      bVar2 = basic::FileInfo::isMissing(pFVar3);
      if (!bVar2) {
        n = 1;
        do {
          bVar4 = uVar1 == n;
          if (bVar4) {
            return bVar4;
          }
          pFVar3 = BuildValue::getNthOutputInfo(result,n);
          bVar2 = basic::FileInfo::isMissing(pFVar3);
          n = n + 1;
        } while (!bVar2);
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ExternalCommand::canUpdateIfNewerWithResult(const BuildValue& result) {
  // Unless `allowModifiedOutputs` is specified, we always need to update if
  // ran.
  if (!allowModifiedOutputs)
    return false;

  // If it was specified, then we can update if all of our outputs simply exist.
  for (unsigned i = 0, e = result.getNumOutputs(); i != e; ++i) {
    const FileInfo& outputInfo = result.getNthOutputInfo(i);

    // If the output is missing, we need to rebuild.
    if (outputInfo.isMissing())
      return false;
  }
  return true;
}